

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

void __thiscall
rlottie::internal::renderer::SolidLayer::SolidLayer(SolidLayer *this,Layer *layerData)

{
  Layer::Layer(&this->super_Layer,layerData);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__SolidLayer_00140ba8;
  Drawable::Drawable(&this->mRenderNode);
  vcow_ptr<VPath::VPathData>::vcow_ptr(&(this->mPath).d);
  this->mDrawableList = &(this->mRenderNode).super_VDrawable;
  return;
}

Assistant:

renderer::SolidLayer::SolidLayer(model::Layer *layerData)
    : renderer::Layer(layerData)
{
    mDrawableList = &mRenderNode;
}